

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::HttpEntityBodyReader::~HttpEntityBodyReader(HttpEntityBodyReader *this)

{
  String local_48;
  bool local_2d;
  bool _kj_shouldLog;
  HttpInputStreamImpl *local_20;
  HttpInputStreamImpl *inner;
  HttpInputStreamImpl *_inner1898;
  HttpEntityBodyReader *this_local;
  
  (this->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_00d944a8;
  _inner1898 = (HttpInputStreamImpl *)this;
  if ((this->finished & 1U) == 0) {
    inner = kj::_::readMaybe<kj::(anonymous_namespace)::HttpInputStreamImpl>(&this->weakInner);
    if (inner == (HttpInputStreamImpl *)0x0) {
      local_2d = kj::_::Debug::shouldLog(ERROR);
      while (local_2d != false) {
        getStackTrace();
        kj::_::Debug::log<char_const(&)[54],kj::String>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x76f,ERROR,
                   "\"HTTP body input stream outlived underlying connection\", kj::getStackTrace()",
                   (char (*) [54])"HTTP body input stream outlived underlying connection",&local_48)
        ;
        String::~String(&local_48);
        local_2d = false;
      }
    }
    else {
      local_20 = inner;
      WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::unsetCurrentWrapper
                (&inner->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>,
                 &this->weakInner);
      HttpInputStreamImpl::abortRead(local_20);
    }
  }
  AsyncInputStream::~AsyncInputStream(&this->super_AsyncInputStream);
  return;
}

Assistant:

~HttpEntityBodyReader() noexcept(false) {
    if (!finished) {
      KJ_IF_SOME(inner, weakInner) {
        inner.unsetCurrentWrapper(weakInner);
        inner.abortRead();
      } else {
        // Since we're in a destructor, log an error instead of throwing.
        KJ_LOG(ERROR, "HTTP body input stream outlived underlying connection", kj::getStackTrace());
      }
    }